

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

bool __thiscall QTabBar::event(QTabBar *this,QEvent *event)

{
  long lVar1;
  Duration duration;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  MouseButtons MVar6;
  QTabBarPrivate *this_00;
  QPoint QVar7;
  ulong uVar8;
  QPoint *text;
  Tab *pTVar9;
  long lVar10;
  qsizetype qVar11;
  const_reference ppTVar12;
  QStyle *pQVar13;
  sockaddr *__addr;
  QEvent *in_RSI;
  QEvent *pQVar14;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QRect QVar15;
  int tabIndex;
  Tab *tab_3;
  int i;
  QShortcutEvent *se;
  Tab *tab_2;
  Tab *tab_1;
  Tab *tab;
  QHoverEvent *he;
  QTabBarPrivate *d;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  QTabBarPrivate *in_stack_fffffffffffffe80;
  QBasicTimer *this_01;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  QTabBarPrivate *in_stack_fffffffffffffe90;
  int index;
  QPoint *in_stack_fffffffffffffe98;
  QTabBarPrivate *in_stack_fffffffffffffea0;
  QTabBarPrivate *this_02;
  QRect *in_stack_fffffffffffffea8;
  QWidget *in_stack_fffffffffffffeb0;
  QPoint *pos;
  int local_10c;
  bool local_c5;
  QPoint local_60;
  undefined8 local_58;
  undefined8 local_50;
  QPoint local_48;
  undefined8 local_40;
  QEvent *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = in_RSI;
  this_00 = d_func((QTabBar *)0x6af9de);
  iVar4 = (int)pQVar14;
  TVar3 = QEvent::type(in_RSI);
  switch(TVar3) {
  case MouseButtonPress:
  case MouseButtonRelease:
  case MouseMove:
    QSinglePointEvent::position((QSinglePointEvent *)0x6b0103);
    QVar7 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffe90);
    this_00->mousePosition = QVar7;
    MVar6 = QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_fffffffffffffe80);
    (this_00->mouseButtons).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
    super_QFlagsStorage<Qt::MouseButton>.i =
         (Int)MVar6.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
              super_QFlagsStorage<Qt::MouseButton>.i;
    break;
  default:
    break;
  case Move:
    QTabBarPrivate::updateMacBorderMetrics(this_00);
    break;
  case DragEnter:
    if ((*(ushort *)&this_00->field_0x2d0 >> 0xc & 1) != 0) {
      QEvent::accept(in_RSI,iVar4,__addr,&switchD_006afa19::switchdataD_00b24cf0);
    }
    break;
  case DragMove:
    if ((*(ushort *)&this_00->field_0x2d0 >> 0xc & 1) != 0) {
      QDropEvent::position
                ((QDropEvent *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar5 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      QPointF::toPoint((QPointF *)in_stack_fffffffffffffe90);
      iVar4 = tabAt((QTabBar *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      bVar2 = isTabEnabled((QTabBar *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           iVar5);
      if ((bVar2) && (this_00->switchTabCurrentIndex != iVar4)) {
        this_00->switchTabCurrentIndex = iVar4;
        this_01 = &this_00->switchTabTimer;
        pQVar13 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x68,0,in_RDI);
        ms<(char)49>();
        std::chrono::operator*
                  ((int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (duration<long,_std::ratio<1L,_1000L>_> *)0x6b0094);
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<1l,1000l>,void>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)this_01,
                   (duration<long,_std::ratio<1L,_1000L>_> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        duration.__r._4_4_ = in_stack_fffffffffffffe8c;
        duration.__r._0_4_ = in_stack_fffffffffffffe88;
        QBasicTimer::start((QBasicTimer *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),duration,
                           (QObject *)0x6b00c8);
      }
      QEvent::ignore(in_RSI);
    }
    break;
  case DragLeave:
  case Drop:
    QTabBarPrivate::killSwitchTabTimer(in_stack_fffffffffffffe80);
    QEvent::ignore(in_RSI);
    break;
  case ToolTip:
    QHelpEvent::pos((QHelpEvent *)in_RSI);
    tabAt((QTabBar *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    iVar4 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    pTVar9 = QTabBarPrivate::at(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    if ((pTVar9 != (Tab *)0x0) && (bVar2 = QString::isEmpty((QString *)0x6afcf7), !bVar2)) {
      text = QHelpEvent::globalPos((QHelpEvent *)in_RSI);
      pos = (QPoint *)&pTVar9->toolTip;
      QRect::QRect((QRect *)in_stack_fffffffffffffe80);
      QToolTip::showText(pos,(QString *)text,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         iVar4);
      local_c5 = true;
      goto LAB_006b0189;
    }
    break;
  case WhatsThis:
    this_02 = this_00;
    QHelpEvent::pos((QHelpEvent *)in_RSI);
    QTabBarPrivate::indexAtPos(this_02,(QPoint *)this_00);
    pTVar9 = QTabBarPrivate::at(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    if ((pTVar9 != (Tab *)0x0) && (bVar2 = QString::isEmpty((QString *)0x6afe49), !bVar2)) {
      QHelpEvent::globalPos((QHelpEvent *)in_RSI);
      QWhatsThis::showText
                ((QPoint *)this_02,(QString *)this_00,(QWidget *)in_stack_fffffffffffffe90);
      local_c5 = true;
      goto LAB_006b0189;
    }
    break;
  case Shortcut:
    local_10c = 0;
    while( true ) {
      lVar10 = (long)local_10c;
      qVar11 = QList<QTabBarPrivate::Tab_*>::size(&this_00->tabList);
      if (qVar11 <= lVar10) break;
      ppTVar12 = QList<QTabBarPrivate::Tab_*>::at
                           ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffe80,
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      index = (int)((ulong)lVar10 >> 0x20);
      iVar4 = (*ppTVar12)->shortcutId;
      iVar5 = QShortcutEvent::shortcutId((QShortcutEvent *)in_RSI);
      if (iVar4 == iVar5) {
        setCurrentIndex((QTabBar *)in_stack_fffffffffffffe98,index);
        local_c5 = true;
        goto LAB_006b0189;
      }
      local_10c = local_10c + 1;
    }
    break;
  case QueryWhatsThis:
    QHelpEvent::pos((QHelpEvent *)in_RSI);
    QTabBarPrivate::indexAtPos(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    pTVar9 = QTabBarPrivate::at(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    if ((pTVar9 == (Tab *)0x0) || (bVar2 = QString::isEmpty((QString *)0x6afdc5), bVar2)) {
      QEvent::ignore(in_RSI);
    }
    local_c5 = true;
    goto LAB_006b0189;
  case HoverEnter:
  case HoverMove:
    QSinglePointEvent::position((QSinglePointEvent *)0x6afa39);
    QVar7 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffe90);
    this_00->mousePosition = QVar7;
    uVar8 = QRect::contains((QPoint *)&(this_00->super_QWidgetPrivate).field_0x254,
                            (bool)((char)this_00 + 'l'));
    if ((uVar8 & 1) == 0) {
      bVar2 = QRect::isValid((QRect *)in_stack_fffffffffffffe80);
      if (bVar2) {
        QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (QRect *)in_stack_fffffffffffffe80);
      }
      iVar4 = tabAt((QTabBar *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
      this_00->hoverIndex = iVar4;
      bVar2 = QTabBarPrivate::validIndex(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      if (bVar2) {
        QVar15 = tabRect((QTabBar *)in_stack_fffffffffffffea8,iVar5);
        *(long *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar15._0_8_;
        local_28 = QVar15._8_8_;
        *(undefined8 *)&this_00->field_0x25c = local_28;
        QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (QRect *)in_stack_fffffffffffffe80);
      }
      else {
        QRect::QRect((QRect *)in_stack_fffffffffffffe80);
        *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = local_40;
        *(QEvent **)&this_00->field_0x25c = in_stack_ffffffffffffffc8;
      }
    }
    local_c5 = true;
    goto LAB_006b0189;
  case HoverLeave:
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   in_stack_fffffffffffffe78);
    this_00->mousePosition = local_48;
    bVar2 = QRect::isValid((QRect *)in_stack_fffffffffffffe80);
    if (bVar2) {
      QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (QRect *)in_stack_fffffffffffffe80);
    }
    this_00->hoverIndex = -1;
    QRect::QRect((QRect *)in_stack_fffffffffffffe80);
    *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = local_58;
    *(undefined8 *)&this_00->field_0x25c = local_50;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffe80);
    this_00->accumulatedAngleDelta = local_60;
    local_c5 = true;
    goto LAB_006b0189;
  }
  local_c5 = QWidget::event(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
LAB_006b0189:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c5;
  }
  __stack_chk_fail();
}

Assistant:

bool QTabBar::event(QEvent *event)
{
    Q_D(QTabBar);
    switch (event->type()) {
    case QEvent::HoverMove:
    case QEvent::HoverEnter: {
        QHoverEvent *he = static_cast<QHoverEvent *>(event);
        d->mousePosition = he->position().toPoint();
        if (!d->hoverRect.contains(d->mousePosition)) {
            if (d->hoverRect.isValid())
                update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        return true;
    }
    case QEvent::HoverLeave: {
        d->mousePosition = {-1, -1};
        if (d->hoverRect.isValid())
            update(d->hoverRect);
        d->hoverIndex = -1;
        d->hoverRect = QRect();
#if QT_CONFIG(wheelevent)
        d->accumulatedAngleDelta = QPoint();
#endif
        return true;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (const QTabBarPrivate::Tab *tab = d->at(tabAt(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->toolTip.isEmpty()) {
                QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), tab->toolTip, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(tooltip)
#if QT_CONFIG(whatsthis)
    case QEvent::QEvent::QueryWhatsThis: {
        const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()));
        if (!tab || tab->whatsThis.isEmpty())
            event->ignore();
        return true;
    }
    case QEvent::WhatsThis:
        if (const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->whatsThis.isEmpty()) {
                QWhatsThis::showText(static_cast<QHelpEvent*>(event)->globalPos(),
                                     tab->whatsThis, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(whatsthis)
#ifndef QT_NO_SHORTCUT

    case QEvent::Shortcut: {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(event);
        for (int i = 0; i < d->tabList.size(); ++i) {
            const QTabBarPrivate::Tab *tab = d->tabList.at(i);
            if (tab->shortcutId == se->shortcutId()) {
                setCurrentIndex(i);
                return true;
            }
        }
    }
        break;
#endif
    case QEvent::Move:
        d->updateMacBorderMetrics();
        break;
#if QT_CONFIG(draganddrop)

    case QEvent::DragEnter:
        if (d->changeCurrentOnDrag)
            event->accept();
        break;
    case QEvent::DragMove:
        if (d->changeCurrentOnDrag) {
            const int tabIndex = tabAt(static_cast<QDragMoveEvent *>(event)->position().toPoint());
            if (isTabEnabled(tabIndex) && d->switchTabCurrentIndex != tabIndex) {
                d->switchTabCurrentIndex = tabIndex;
                d->switchTabTimer.start(
                    style()->styleHint(QStyle::SH_TabBar_ChangeCurrentDelay, nullptr, this) * 1ms, this);
            }
            event->ignore();
        }
        break;
    case QEvent::DragLeave:
    case QEvent::Drop:
        d->killSwitchTabTimer();
        event->ignore();
        break;
#endif
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        d->mousePosition = static_cast<QMouseEvent *>(event)->position().toPoint();
        d->mouseButtons = static_cast<QMouseEvent *>(event)->buttons();
        break;
    default:
        break;
    }

    return QWidget::event(event);
}